

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void CConsole::Con_EvalIf(IResult *pResult,void *pUserData)

{
  long lVar1;
  void *pvVar2;
  FCommandCallback p_Var3;
  undefined4 uVar4;
  int iVar5;
  undefined4 extraout_var;
  CCommand *pCVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar7;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  FCommandCallback *pp_Var8;
  char *pcVar9;
  CChain *pChainInfo;
  void **ppvVar10;
  long in_FS_OFFSET;
  bool bVar11;
  undefined8 uStack_14f0;
  char aBuf [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = (*pResult->_vptr_IResult[4])(pResult,0);
  pCVar6 = FindCommand((CConsole *)pUserData,(char *)CONCAT44(extraout_var,iVar5),
                       *(int *)((long)pUserData + 0x10));
  if (pCVar6 == (CCommand *)0x0) {
    iVar5 = (*pResult->_vptr_IResult[4])(pResult,0);
    str_format(aBuf,0x80,"No such command: \'%s\'.",CONCAT44(extraout_var_01,iVar5));
    (**(code **)(*pUserData + 200))(pUserData,0,"console",aBuf,0);
    goto LAB_001a7973;
  }
  pp_Var8 = &pCVar6->m_pfnCallback;
  ppvVar10 = &pCVar6->m_pUserData;
  while( true ) {
    pvVar2 = *ppvVar10;
    p_Var3 = *pp_Var8;
    if (p_Var3 != Con_Chain) break;
    pp_Var8 = (FCommandCallback *)((long)pvVar2 + 8);
    ppvVar10 = (void **)((long)pvVar2 + 0x10);
  }
  CResult::CResult((CResult *)aBuf);
  (*p_Var3)((IResult *)aBuf,pvVar2);
  uVar4 = aBuf._12_4_;
  if (p_Var3 == IntVariableCommand) {
    iVar5 = (*pResult->_vptr_IResult[4])(pResult,2);
    iVar5 = atoi((char *)CONCAT44(extraout_var_02,iVar5));
    bVar11 = uVar4 == iVar5;
  }
  else {
    iVar5 = (*pResult->_vptr_IResult[4])(pResult,2);
    iVar5 = str_comp_nocase(aBuf + 0x10,(char *)CONCAT44(extraout_var_00,iVar5));
    bVar11 = iVar5 == 0;
  }
  iVar5 = (*pResult->_vptr_IResult[4])(pResult,1);
  iVar5 = str_comp((char *)CONCAT44(extraout_var_03,iVar5),"!=");
  if (iVar5 == 0) {
    bVar11 = (bool)(bVar11 ^ 1);
  }
  else {
    iVar5 = (*pResult->_vptr_IResult[4])(pResult,1);
    iVar5 = str_comp((char *)CONCAT44(extraout_var_04,iVar5),"==");
    if ((p_Var3 == StrVariableCommand) && (iVar5 != 0)) {
      lVar7 = *pUserData;
      pcVar9 = "Error: invalid comperator for type string";
LAB_001a77a4:
      (**(code **)(lVar7 + 200))(pUserData,0,"console",pcVar9,0);
    }
    else {
      iVar5 = (*pResult->_vptr_IResult[4])(pResult,1);
      iVar5 = str_comp((char *)CONCAT44(extraout_var_05,iVar5),">");
      if (iVar5 == 0) {
        iVar5 = (*pResult->_vptr_IResult[4])(pResult,2);
        iVar5 = atoi((char *)CONCAT44(extraout_var_10,iVar5));
        bVar11 = iVar5 < (int)aBuf._12_4_;
      }
      else {
        iVar5 = (*pResult->_vptr_IResult[4])(pResult,1);
        iVar5 = str_comp((char *)CONCAT44(extraout_var_06,iVar5),"<");
        if (iVar5 == 0) {
          iVar5 = (*pResult->_vptr_IResult[4])(pResult,2);
          iVar5 = atoi((char *)CONCAT44(extraout_var_11,iVar5));
          bVar11 = (int)aBuf._12_4_ < iVar5;
        }
        else {
          iVar5 = (*pResult->_vptr_IResult[4])(pResult,1);
          iVar5 = str_comp((char *)CONCAT44(extraout_var_07,iVar5),"<=");
          if (iVar5 == 0) {
            iVar5 = (*pResult->_vptr_IResult[4])(pResult,2);
            iVar5 = atoi((char *)CONCAT44(extraout_var_12,iVar5));
            bVar11 = (int)aBuf._12_4_ <= iVar5;
          }
          else {
            iVar5 = (*pResult->_vptr_IResult[4])(pResult,1);
            iVar5 = str_comp((char *)CONCAT44(extraout_var_08,iVar5),">=");
            if (iVar5 == 0) {
              iVar5 = (*pResult->_vptr_IResult[4])(pResult,2);
              iVar5 = atoi((char *)CONCAT44(extraout_var_13,iVar5));
              bVar11 = iVar5 <= (int)aBuf._12_4_;
            }
            else {
              iVar5 = (*pResult->_vptr_IResult[4])(pResult,1);
              iVar5 = str_comp((char *)CONCAT44(extraout_var_09,iVar5),"==");
              if (iVar5 != 0) {
                lVar7 = *pUserData;
                pcVar9 = "Error: invalid comperator for type integer";
                goto LAB_001a77a4;
              }
            }
          }
        }
      }
    }
  }
  if (4 < (int)pResult->m_NumArgs) {
    iVar5 = (*pResult->_vptr_IResult[4])(pResult,4);
    iVar5 = str_comp((char *)CONCAT44(extraout_var_14,iVar5),"else");
    if (iVar5 != 0) {
      (**(code **)(*pUserData + 200))(pUserData,0,"console","Error: expected else",0);
    }
  }
  if (bVar11) {
    uStack_14f0 = 3;
  }
  else {
    if (pResult->m_NumArgs != 6) goto LAB_001a7973;
    uStack_14f0 = 5;
  }
  iVar5 = (*pResult->_vptr_IResult[4])(pResult,uStack_14f0);
  (**(code **)(*pUserData + 0x98))(pUserData,iVar5);
LAB_001a7973:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsole::Con_EvalIf(IResult *pResult, void *pUserData)
{
	CConsole *pConsole = static_cast<CConsole *>(pUserData);
	CCommand *pCommand = pConsole->FindCommand(pResult->GetString(0), pConsole->m_FlagMask);
	char aBuf[128];
	if(!pCommand)
	{
		str_format(aBuf, sizeof(aBuf), "No such command: '%s'.", pResult->GetString(0));
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
		return;
	}
	FCommandCallback pfnCallback = pCommand->m_pfnCallback;
	void *pCallbackUserData = pCommand->m_pUserData;
	pConsole->TraverseChain(&pfnCallback, &pCallbackUserData);
	CResult Result;
	pfnCallback(&Result, pCallbackUserData);
	bool Condition = false;
	if(pfnCallback == IntVariableCommand)
		Condition = Result.m_Value == atoi(pResult->GetString(2));
	else
		Condition = !str_comp_nocase(Result.m_aValue, pResult->GetString(2));
	if(!str_comp(pResult->GetString(1), "!="))
		Condition = !Condition;
	else if(str_comp(pResult->GetString(1), "==") && pfnCallback == StrVariableCommand)
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", "Error: invalid comperator for type string");
	else if(!str_comp(pResult->GetString(1), ">"))
		Condition = Result.m_Value > atoi(pResult->GetString(2));
	else if(!str_comp(pResult->GetString(1), "<"))
		Condition = Result.m_Value < atoi(pResult->GetString(2));
	else if(!str_comp(pResult->GetString(1), "<="))
		Condition = Result.m_Value <= atoi(pResult->GetString(2));
	else if(!str_comp(pResult->GetString(1), ">="))
		Condition = Result.m_Value >= atoi(pResult->GetString(2));
	else if(str_comp(pResult->GetString(1), "=="))
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", "Error: invalid comperator for type integer");

	if(pResult->NumArguments() > 4 && str_comp(pResult->GetString(4), "else"))
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", "Error: expected else");

	if(Condition)
		pConsole->ExecuteLine(pResult->GetString(3));
	else if(pResult->NumArguments() == 6)
		pConsole->ExecuteLine(pResult->GetString(5));
}